

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * strAccumFinishRealloc(StrAccum *p)

{
  char *__dest;
  ulong n;
  
  n = (ulong)(p->nChar + 1);
  if (p->db == (sqlite3 *)0x0) {
    __dest = (char *)sqlite3Malloc(n);
  }
  else {
    __dest = (char *)sqlite3DbMallocRawNN(p->db,n);
  }
  if (__dest == (char *)0x0) {
    p->accError = '\a';
    if (p->mxAlloc != 0) {
      sqlite3_str_reset(p);
    }
  }
  else {
    memcpy(__dest,p->zText,(ulong)(p->nChar + 1));
    p->printfFlags = p->printfFlags | 4;
  }
  p->zText = __dest;
  return __dest;
}

Assistant:

static SQLITE_NOINLINE char *strAccumFinishRealloc(StrAccum *p){
  char *zText;
  assert( p->mxAlloc>0 && !isMalloced(p) );
  zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
  if( zText ){
    memcpy(zText, p->zText, p->nChar+1);
    p->printfFlags |= SQLITE_PRINTF_MALLOCED;
  }else{
    setStrAccumError(p, SQLITE_NOMEM);
  }
  p->zText = zText;
  return zText;
}